

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbrReach.c
# Opt level: O2

int Aig_ManComputeReachable
              (DdManager *dd,Aig_Man_t *p,DdNode **pbParts,DdNode *bInitial,DdNode **pbOutputs,
              Saig_ParBbr_t *pPars,int fCheckOutputs)

{
  bool bVar1;
  FILE *pFVar2;
  DdNode **ppDVar3;
  int iVar4;
  DdNode *pDVar5;
  Bbr_ImageTree_t *pTree;
  Vec_Ptr_t *p_00;
  abctime aVar6;
  DdNode *pDVar7;
  Abc_Cex_t *pAVar8;
  char *__format;
  int iVar9;
  ulong uVar11;
  uint uVar12;
  double dVar13;
  double dVar14;
  DdNode *local_88;
  uint local_7c;
  Bbr_ImageTree2_t *local_70;
  Cudd_ReorderingType method;
  abctime local_40;
  DdNode **local_38;
  DdManager *pDVar10;
  
  local_38 = pbOutputs;
  local_40 = Abc_Clock();
  iVar4 = Cudd_ReorderingStatus(dd,&method);
  if (iVar4 != 0) {
    Cudd_AutodynDisable(dd);
  }
  pDVar5 = Bbr_bddComputeRangeCube(dd,p->nTruePis,p->nRegs + p->nTruePis);
  Cudd_Ref(pDVar5);
  iVar9 = p->nRegs;
  if (pPars->fPartition == 0) {
    local_70 = Bbr_bddImageStart2(dd,pDVar5,iVar9,pbParts,iVar9,
                                  dd->vars + (long)p->nTruePis + (long)iVar9,pPars->fVerbose);
    pTree = (Bbr_ImageTree_t *)0x0;
  }
  else {
    pTree = Bbr_bddImageStart(dd,pDVar5,iVar9,pbParts,iVar9,
                              dd->vars + (long)p->nTruePis + (long)iVar9,pPars->nBddMax,
                              pPars->fVerbose);
    local_70 = (Bbr_ImageTree2_t *)0x0;
  }
  pDVar10 = dd;
  Cudd_RecursiveDeref(dd,pDVar5);
  iVar9 = (int)pDVar10;
  if (pTree == (Bbr_ImageTree_t *)0x0) {
    iVar4 = -1;
    if (pPars->fSilent == 0) {
      printf("BDDs blew up during qualitification scheduling.  ");
    }
  }
  else {
    if (iVar4 != 0) {
      pDVar10 = dd;
      Cudd_AutodynEnable(dd,method);
      iVar9 = (int)pDVar10;
    }
    p_00 = Vec_PtrAlloc(iVar9);
    Cudd_Ref(bInitial);
    Cudd_Ref(bInitial);
    Vec_PtrPush(p_00,bInitial);
    Cudd_Ref(bInitial);
    local_7c = 0;
    pDVar5 = (DdNode *)0x0;
    local_88 = bInitial;
    for (uVar12 = 0; (int)uVar12 < pPars->nIterMax; uVar12 = uVar12 + 1) {
      bVar1 = true;
      iVar4 = pPars->TimeLimit;
      if ((long)iVar4 != 0) {
        aVar6 = Abc_Clock();
        if ((long)iVar4 <= (aVar6 - local_40) / 1000000) {
          printf("Reached timeout after image computation (%d seconds).\n",
                 (ulong)(uint)pPars->TimeLimit,(aVar6 - local_40) % 1000000);
          Vec_PtrFree(p_00);
          if (pPars->fPartition == 0) {
            Bbr_bddImageTreeDelete2(local_70);
          }
          else {
            Bbr_bddImageTreeDelete(pTree);
          }
          goto LAB_0068edfb;
        }
      }
      if (pPars->fPartition == 0) {
        pDVar7 = Bbr_bddImageCompute2(local_70,bInitial);
      }
      else {
        pDVar7 = Bbr_bddImageCompute(pTree,bInitial);
      }
      if (pDVar7 == (DdNode *)0x0) {
        if (pPars->fSilent == 0) {
          printf("BDDs blew up during image computation.  ");
        }
        if (pPars->fPartition == 0) {
          Bbr_bddImageTreeDelete2(local_70);
        }
        else {
          Bbr_bddImageTreeDelete(pTree);
        }
        Vec_PtrFree(p_00);
        pPars->iFrame = uVar12 - 1;
        goto LAB_0068ee02;
      }
      Cudd_Ref(pDVar7);
      Cudd_RecursiveDeref(dd,bInitial);
      pDVar5 = Cudd_bddVarMap(dd,pDVar7);
      Cudd_Ref(pDVar5);
      Cudd_RecursiveDeref(dd,pDVar7);
      iVar4 = Cudd_bddLeq(dd,pDVar5,local_88);
      if (iVar4 != 0) {
        bVar1 = false;
        goto LAB_0068ec2d;
      }
      local_7c = Cudd_DagSize(pDVar5);
      ppDVar3 = local_38;
      if (pPars->nBddMax < (int)local_7c) goto LAB_0068ec2d;
      uVar11 = 0;
      while( true ) {
        iVar4 = p->nTruePos;
        if ((long)iVar4 <= (long)uVar11) break;
        if ((fCheckOutputs != 0) &&
           (iVar4 = Cudd_bddLeq(dd,pDVar5,(DdNode *)((ulong)ppDVar3[uVar11] ^ 1)), iVar4 == 0)) {
          pDVar7 = Cudd_bddIntersect(dd,pDVar5,ppDVar3[uVar11]);
          Cudd_Ref(pDVar7);
          if (p->pSeqModel != (Abc_Cex_t *)0x0) {
            __assert_fail("p->pSeqModel == NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/bbr/bbrReach.c"
                          ,0x151,
                          "int Aig_ManComputeReachable(DdManager *, Aig_Man_t *, DdNode **, DdNode *, DdNode **, Saig_ParBbr_t *, int)"
                         );
          }
          pAVar8 = Aig_ManVerifyUsingBddsCountExample
                             (p,dd,pbParts,p_00,pDVar7,(int)uVar11,pPars->fVerbose,pPars->fSilent);
          p->pSeqModel = pAVar8;
          pDVar10 = dd;
          Cudd_RecursiveDeref(dd,pDVar7);
          if (pPars->fSilent == 0) {
            Abc_Print((int)pDVar10,"Output %d of miter \"%s\" was asserted in frame %d. ",
                      uVar11 & 0xffffffff,p->pName,(ulong)(uint)p_00->nSize);
          }
          Cudd_RecursiveDeref(dd,local_88);
          pPars->iFrame = uVar12;
          iVar4 = p->nTruePos;
          local_88 = (DdNode *)0x0;
          break;
        }
        uVar11 = uVar11 + 1;
      }
      if ((int)uVar11 < iVar4) goto LAB_0068ec2d;
      bInitial = Cudd_bddAnd(dd,pDVar5,(DdNode *)((ulong)local_88 ^ 1));
      Cudd_Ref(bInitial);
      Vec_PtrPush(p_00,bInitial);
      Cudd_Ref(bInitial);
      pDVar7 = Cudd_bddOr(dd,local_88,pDVar5);
      Cudd_Ref(pDVar7);
      Cudd_RecursiveDeref(dd,local_88);
      Cudd_RecursiveDeref(dd,pDVar5);
      if (((pPars->fVerbose != 0) &&
          (fprintf(_stdout,"Frame = %3d. BDD = %5d. ",(ulong)uVar12,(ulong)local_7c),
          pPars->fVerbose != 0)) && (fputc(10,_stdout), pPars->fVerbose != 0)) {
        dVar13 = Cudd_CountMinterm(dd,pDVar7,p->nRegs);
        pFVar2 = _stdout;
        dVar14 = ldexp(1.0,p->nRegs);
        fprintf(pFVar2,"Reachable states = %.0f. (Ratio = %.4f %%)\n",dVar13,
                (dVar13 * 100.0) / dVar14);
        fflush(_stdout);
      }
      local_88 = pDVar7;
    }
    bVar1 = true;
LAB_0068ec2d:
    Cudd_RecursiveDeref(dd,pDVar5);
    for (iVar4 = 0; iVar4 < p_00->nSize; iVar4 = iVar4 + 1) {
      pDVar5 = (DdNode *)Vec_PtrEntry(p_00,iVar4);
      Cudd_RecursiveDeref(dd,pDVar5);
    }
    Vec_PtrFree(p_00);
    if (pPars->fPartition == 0) {
      Bbr_bddImageTreeDelete2(local_70);
    }
    else {
      Bbr_bddImageTreeDelete(pTree);
    }
    if (local_88 == (DdNode *)0x0) {
      iVar4 = 0;
    }
    else {
      if (pPars->fVerbose != 0) {
        dVar13 = Cudd_CountMinterm(dd,local_88,p->nRegs);
        if (pPars->nIterMax < (int)uVar12) {
          __format = "Reachability analysis is stopped after %d frames.\n";
        }
        else {
          __format = "Reachability analysis completed after %d frames.\n";
          if (pPars->nBddMax < (int)local_7c) {
            __format = "Reachability analysis is stopped after %d frames.\n";
          }
        }
        fprintf(_stdout,__format,(ulong)uVar12);
        pFVar2 = _stdout;
        dVar14 = ldexp(1.0,p->nRegs);
        fprintf(pFVar2,"Reachable states = %.0f. (Ratio = %.4f %%)\n",dVar13,
                (dVar13 * 100.0) / dVar14);
        fflush(_stdout);
      }
      Cudd_RecursiveDeref(dd,local_88);
      if (bVar1) {
        if (((int)uVar12 < pPars->nIterMax) && ((int)local_7c < pPars->nBddMax)) {
          __assert_fail("nIters >= pPars->nIterMax || nBddSize >= pPars->nBddMax",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/bbr/bbrReach.c"
                        ,0x1a4,
                        "int Aig_ManComputeReachable(DdManager *, Aig_Man_t *, DdNode **, DdNode *, DdNode **, Saig_ParBbr_t *, int)"
                       );
        }
        if (pPars->fSilent == 0) {
          printf("Verified only for states reachable in %d frames.  ",(ulong)uVar12);
        }
LAB_0068edfb:
        pPars->iFrame = uVar12 - 1;
LAB_0068ee02:
        iVar4 = -1;
      }
      else {
        if (pPars->fSilent == 0) {
          printf("The miter is proved unreachable after %d iterations.  ",(ulong)uVar12);
        }
        pPars->iFrame = uVar12 - 1;
        iVar4 = 1;
      }
    }
  }
  return iVar4;
}

Assistant:

int Aig_ManComputeReachable( DdManager * dd, Aig_Man_t * p, DdNode ** pbParts, DdNode * bInitial, DdNode ** pbOutputs, Saig_ParBbr_t * pPars, int fCheckOutputs )
{
    int fInternalReorder = 0;
    Bbr_ImageTree_t * pTree = NULL; // Suppress "might be used uninitialized"
    Bbr_ImageTree2_t * pTree2 = NULL; // Supprses "might be used uninitialized"
    DdNode * bReached, * bCubeCs;
    DdNode * bCurrent;
    DdNode * bNext = NULL; // Suppress "might be used uninitialized"
    DdNode * bTemp;
    Cudd_ReorderingType method;
    int i, nIters, nBddSize = 0, status;
    int nThreshold = 10000;
    abctime clk = Abc_Clock();
    Vec_Ptr_t * vOnionRings;
    int fixedPoint = 0;

    status = Cudd_ReorderingStatus( dd, &method );
    if ( status )
        Cudd_AutodynDisable( dd );

    // start the image computation
    bCubeCs  = Bbr_bddComputeRangeCube( dd, Saig_ManPiNum(p), Saig_ManCiNum(p) );    Cudd_Ref( bCubeCs );
    if ( pPars->fPartition )
        pTree = Bbr_bddImageStart( dd, bCubeCs, Saig_ManRegNum(p), pbParts, Saig_ManRegNum(p), dd->vars+Saig_ManCiNum(p), pPars->nBddMax, pPars->fVerbose );
    else
        pTree2 = Bbr_bddImageStart2( dd, bCubeCs, Saig_ManRegNum(p), pbParts, Saig_ManRegNum(p), dd->vars+Saig_ManCiNum(p), pPars->fVerbose );
    Cudd_RecursiveDeref( dd, bCubeCs );
    if ( pTree == NULL )
    {
        if ( !pPars->fSilent )
            printf( "BDDs blew up during qualitification scheduling.  " );
        return -1;
    }

    if ( status )
        Cudd_AutodynEnable( dd, method );

    // start the onion rings
    vOnionRings = Vec_PtrAlloc( 1000 );

    // perform reachability analysis
    bCurrent = bInitial;   Cudd_Ref( bCurrent );
    bReached = bInitial;   Cudd_Ref( bReached );
    Vec_PtrPush( vOnionRings, bCurrent );  Cudd_Ref( bCurrent );
    for ( nIters = 0; nIters < pPars->nIterMax; nIters++ )
    { 
        // check the runtime limit
        if ( pPars->TimeLimit && pPars->TimeLimit <= (Abc_Clock()-clk)/CLOCKS_PER_SEC )
        {
            printf( "Reached timeout after image computation (%d seconds).\n",  pPars->TimeLimit );
            Vec_PtrFree( vOnionRings );
            // undo the image tree
            if ( pPars->fPartition )
                Bbr_bddImageTreeDelete( pTree );
            else
                Bbr_bddImageTreeDelete2( pTree2 );
            pPars->iFrame = nIters - 1;
            return -1;
        }

        // compute the next states
        if ( pPars->fPartition )
            bNext = Bbr_bddImageCompute( pTree, bCurrent );           
        else
            bNext = Bbr_bddImageCompute2( pTree2, bCurrent );  
        if ( bNext == NULL )
        {
            if ( !pPars->fSilent )
                printf( "BDDs blew up during image computation.  " );
            if ( pPars->fPartition )
                Bbr_bddImageTreeDelete( pTree );
            else
                Bbr_bddImageTreeDelete2( pTree2 );
            Vec_PtrFree( vOnionRings );
            pPars->iFrame = nIters - 1;
            return -1;
        }
        Cudd_Ref( bNext );
        Cudd_RecursiveDeref( dd, bCurrent );

        // remap these states into the current state vars
        bNext = Cudd_bddVarMap( dd, bTemp = bNext );                    Cudd_Ref( bNext );
        Cudd_RecursiveDeref( dd, bTemp );
        // check if there are any new states
        if ( Cudd_bddLeq( dd, bNext, bReached ) ) {
            fixedPoint = 1;
            break;
        }
        // check the BDD size
        nBddSize = Cudd_DagSize(bNext);
        if ( nBddSize > pPars->nBddMax )
            break;
        // check the result
        for ( i = 0; i < Saig_ManPoNum(p); i++ )
        {
            if ( fCheckOutputs && !Cudd_bddLeq( dd, bNext, Cudd_Not(pbOutputs[i]) ) )
            {
                DdNode * bIntersect;
                bIntersect = Cudd_bddIntersect( dd, bNext, pbOutputs[i] );  Cudd_Ref( bIntersect );
                assert( p->pSeqModel == NULL );
                p->pSeqModel = Aig_ManVerifyUsingBddsCountExample( p, dd, pbParts, 
                    vOnionRings, bIntersect, i, pPars->fVerbose, pPars->fSilent ); 
                Cudd_RecursiveDeref( dd, bIntersect );
                if ( !pPars->fSilent )
                    Abc_Print( 1, "Output %d of miter \"%s\" was asserted in frame %d. ", i, p->pName, Vec_PtrSize(vOnionRings) );
                Cudd_RecursiveDeref( dd, bReached );
                bReached = NULL;
                pPars->iFrame = nIters;
                break;
            }
        }
        if ( i < Saig_ManPoNum(p) )
            break;
        // get the new states
        bCurrent = Cudd_bddAnd( dd, bNext, Cudd_Not(bReached) );        Cudd_Ref( bCurrent );
        Vec_PtrPush( vOnionRings, bCurrent );  Cudd_Ref( bCurrent );
        // minimize the new states with the reached states
//        bCurrent = Cudd_bddConstrain( dd, bTemp = bCurrent, Cudd_Not(bReached) ); Cudd_Ref( bCurrent );
//        Cudd_RecursiveDeref( dd, bTemp );
        // add to the reached states
        bReached = Cudd_bddOr( dd, bTemp = bReached, bNext );           Cudd_Ref( bReached );
        Cudd_RecursiveDeref( dd, bTemp );
        Cudd_RecursiveDeref( dd, bNext );
        if ( pPars->fVerbose )
            fprintf( stdout, "Frame = %3d. BDD = %5d. ", nIters, nBddSize );
        if ( fInternalReorder && pPars->fReorder && nBddSize > nThreshold )
        {
            if ( pPars->fVerbose )
                fprintf( stdout, "Reordering... Before = %5d. ", Cudd_DagSize(bReached) );
            Cudd_ReduceHeap( dd, CUDD_REORDER_SYMM_SIFT, 100 );
            Cudd_AutodynDisable( dd );
            if ( pPars->fVerbose )
                fprintf( stdout, "After = %5d.\r", Cudd_DagSize(bReached) );
            nThreshold *= 2;
        }
        if ( pPars->fVerbose )
//            fprintf( stdout, "\r" );
            fprintf( stdout, "\n" );

        if ( pPars->fVerbose )
        {
            double nMints = Cudd_CountMinterm(dd, bReached, Saig_ManRegNum(p) );
//            Extra_bddPrint( dd, bReached );printf( "\n" );
            fprintf( stdout, "Reachable states = %.0f. (Ratio = %.4f %%)\n", nMints, 100.0*nMints/pow(2.0, Saig_ManRegNum(p)) );
            fflush( stdout ); 
        }

    }
    Cudd_RecursiveDeref( dd, bNext );
    // free the onion rings
    Vec_PtrForEachEntry( DdNode *, vOnionRings, bTemp, i )
        Cudd_RecursiveDeref( dd, bTemp );
    Vec_PtrFree( vOnionRings );
    // undo the image tree
    if ( pPars->fPartition )
        Bbr_bddImageTreeDelete( pTree );
    else
        Bbr_bddImageTreeDelete2( pTree2 );
    if ( bReached == NULL )
        return 0; // proved reachable
    // report the stats
    if ( pPars->fVerbose )
    {
        double nMints = Cudd_CountMinterm(dd, bReached, Saig_ManRegNum(p) );
        if ( nIters > pPars->nIterMax || nBddSize > pPars->nBddMax )
            fprintf( stdout, "Reachability analysis is stopped after %d frames.\n", nIters );
        else
            fprintf( stdout, "Reachability analysis completed after %d frames.\n", nIters );
        fprintf( stdout, "Reachable states = %.0f. (Ratio = %.4f %%)\n", nMints, 100.0*nMints/pow(2.0, Saig_ManRegNum(p)) );
        fflush( stdout );
    }
//ABC_PRB( dd, bReached );
    Cudd_RecursiveDeref( dd, bReached );
    // SPG
    //
    if ( fixedPoint ) {
      if ( !pPars->fSilent ) {
        printf( "The miter is proved unreachable after %d iterations.  ", nIters );
      }
      pPars->iFrame = nIters - 1;
      return 1;
    }
    assert(nIters >= pPars->nIterMax || nBddSize >= pPars->nBddMax);
    if ( !pPars->fSilent )
      printf( "Verified only for states reachable in %d frames.  ", nIters );
    pPars->iFrame = nIters - 1;
    return -1; // undecided
}